

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

channel_s * fio_filter_dup_lock_internal(channel_s *ch,uint64_t hashed,fio_collection_s *c)

{
  uint8_t *puVar1;
  size_t *psVar2;
  fio_lock_i fVar3;
  ulong uVar4;
  ulong uVar5;
  uintptr_t uVar6;
  fio_ch_set__ordered_s_ *pfVar7;
  fio_ch_set__map_s_ *pfVar8;
  channel_s *pcVar9;
  ulong hash_value;
  fio_lock_i ret;
  timespec local_38;
  
  LOCK();
  fVar3 = c->lock;
  c->lock = '\x01';
  UNLOCK();
  local_38.tv_sec = CONCAT71(local_38.tv_sec._1_7_,fVar3);
  while (fVar3 != '\0') {
    local_38.tv_sec = 0;
    local_38.tv_nsec = 1;
    nanosleep(&local_38,(timespec *)0x0);
    LOCK();
    fVar3 = c->lock;
    c->lock = '\x01';
    UNLOCK();
    local_38.tv_sec = CONCAT71(local_38.tv_sec._1_7_,fVar3);
  }
  hash_value = -(ulong)(hashed == 0) | hashed;
  uVar4 = (c->channels).count;
  uVar5 = (c->channels).pos;
  if (uVar5 - uVar4 <= uVar4 >> 1) {
    if (uVar5 < (c->channels).capa) goto LAB_0011758f;
    puVar1 = &(c->channels).used_bits;
    *puVar1 = *puVar1 + '\x01';
  }
  fio_ch_set_rehash(&c->channels);
LAB_0011758f:
  pfVar8 = fio_ch_set__find_map_pos_(&c->channels,hash_value,ch);
  if (pfVar8 == (fio_ch_set__map_s_ *)0x0) {
    pcVar9 = fio_channel_copy(ch);
    uVar6 = (c->channels).pos;
    pfVar7 = (c->channels).ordered;
    pfVar7[uVar6].obj = pcVar9;
    pfVar7[uVar6].hash = hash_value;
    (c->channels).pos = uVar6 + 1;
    (c->channels).count = (c->channels).count + 1;
    fio_ch_set_rehash(&c->channels);
    pcVar9 = (c->channels).ordered[(c->channels).pos - 1].obj;
  }
  else if (pfVar8->pos == (fio_ch_set__ordered_s_ *)0x0) {
    uVar6 = (c->channels).pos;
    pfVar7 = (c->channels).ordered;
    pfVar8->pos = pfVar7 + uVar6;
    (c->channels).pos = uVar6 + 1;
    (c->channels).count = (c->channels).count + 1;
    pfVar8->hash = hash_value;
    pfVar7[uVar6].hash = hash_value;
    pcVar9 = fio_channel_copy(ch);
    pfVar8->pos->obj = pcVar9;
  }
  else {
    if (ch != (channel_s *)0x0) {
      LOCK();
      psVar2 = &ch->ref;
      *psVar2 = *psVar2 - 1;
      UNLOCK();
      if (*psVar2 == 0) {
        free(ch);
      }
    }
    pcVar9 = pfVar8->pos->obj;
  }
  if (pcVar9 != (channel_s *)0x0) {
    LOCK();
    pcVar9->ref = pcVar9->ref + 1;
    UNLOCK();
  }
  LOCK();
  fVar3 = pcVar9->lock;
  pcVar9->lock = '\x01';
  UNLOCK();
  while (fVar3 != '\0') {
    local_38.tv_sec = 0;
    local_38.tv_nsec = 1;
    nanosleep(&local_38,(timespec *)0x0);
    LOCK();
    fVar3 = pcVar9->lock;
    pcVar9->lock = '\x01';
    UNLOCK();
  }
  LOCK();
  c->lock = '\0';
  UNLOCK();
  return pcVar9;
}

Assistant:

static inline channel_s *fio_filter_dup_lock_internal(channel_s *ch,
                                                      uint64_t hashed,
                                                      fio_collection_s *c) {
  fio_lock(&c->lock);
  ch = fio_ch_set_insert(&c->channels, hashed, ch);
  fio_channel_dup(ch);
  fio_lock(&ch->lock);
  fio_unlock(&c->lock);
  return ch;
}